

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
emplaceRealloc<slang::SmallVector<slang::ast::NetAlias,2ul>>
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>> *this,pointer pos,
          SmallVector<slang::ast::NetAlias,_2UL> *args)

{
  ulong uVar1;
  long lVar2;
  SmallVector<slang::ast::NetAlias,_2UL> *__result;
  SmallVector<slang::ast::NetAlias,_2UL> *__result_00;
  ulong uVar3;
  move_iterator<slang::SmallVector<slang::ast::NetAlias,_2UL>_*> __last;
  move_iterator<slang::SmallVector<slang::ast::NetAlias,_2UL>_*> __first;
  SmallVector<slang::ast::NetAlias,_2UL> *this_00;
  
  if (*(long *)(this + 8) == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  uVar3 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar3 < uVar1 * 2) {
    uVar3 = uVar1 * 2;
  }
  if (0x1745d1745d1745d - uVar1 < uVar1) {
    uVar3 = 0x1745d1745d1745d;
  }
  lVar2 = *(long *)this;
  __result = (SmallVector<slang::ast::NetAlias,_2UL> *)operator_new(uVar3 * 0x58);
  this_00 = (SmallVector<slang::ast::NetAlias,_2UL> *)(((long)pos - lVar2) + (long)__result);
  SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
            (this_00,&args->super_SmallVectorBase<slang::ast::NetAlias>);
  __first._M_current = *(SmallVector<slang::ast::NetAlias,_2UL> **)this;
  __last._M_current = __first._M_current + *(long *)(this + 8);
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::SmallVector<slang::ast::NetAlias,2ul>*>,slang::SmallVector<slang::ast::NetAlias,2ul>*>
              (__first,(move_iterator<slang::SmallVector<slang::ast::NetAlias,_2UL>_*>)pos,__result)
    ;
    __last._M_current =
         (SmallVector<slang::ast::NetAlias,_2UL> *)(*(long *)(this + 8) * 0x58 + *(long *)this);
    __result_00 = this_00 + 1;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::SmallVector<slang::ast::NetAlias,2ul>*>,slang::SmallVector<slang::ast::NetAlias,2ul>*>
            (__first,__last,__result_00);
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
            ((SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *)this,
             (EVP_PKEY_CTX *)__last._M_current);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar3;
  *(SmallVector<slang::ast::NetAlias,_2UL> **)this = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}